

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

diyfp __thiscall nlohmann::detail::dtoa_impl::diyfp::normalize(diyfp *this,diyfp x)

{
  ulong uVar1;
  diyfp dVar2;
  
  uVar1 = x.f;
  if (this == (diyfp *)0x0) {
    __assert_fail("x.f != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x212f,"static diyfp nlohmann::detail::dtoa_impl::diyfp::normalize(diyfp)");
  }
  for (; -1 < (long)this; this = (diyfp *)((long)this * 2)) {
    uVar1 = (ulong)((int)uVar1 - 1);
  }
  dVar2._8_8_ = uVar1 & 0xffffffff;
  dVar2.f = (uint64_t)this;
  return dVar2;
}

Assistant:

static diyfp normalize(diyfp x) noexcept {
		assert(x.f != 0);

		while ((x.f >> 63) == 0) {
			x.f <<= 1;
			x.e--;
		}

		return x;
	}